

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

bool __thiscall
cfd::core::ScriptElement::ConvertBinaryToNumber(ScriptElement *this,int64_t *int64_value)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  size_type local_48;
  size_t i;
  int64_t val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  bool is_success;
  int64_t *int64_value_local;
  ScriptElement *this_local;
  
  vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&val,
                     &this->binary_data_);
  if ((((this->type_ == kElementBinary) || (this->type_ == kElementNumber)) &&
      (sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&val), sVar2 < 6)
      ) && (pbVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&val),
           (*pbVar3 & 0x7f) != 0)) {
    i = 0;
    for (local_48 = 0;
        sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&val),
        local_48 != sVar2; local_48 = local_48 + 1) {
      pbVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&val,local_48);
      i = (ulong)*pbVar3 << ((byte)(local_48 << 3) & 0x3f) | i;
    }
    pbVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&val);
    if ((*pbVar3 & 0x80) != 0) {
      sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&val);
      i = -(i & (0x80L << (((char)sVar2 + -1) * '\b' & 0x3fU) ^ 0xffffffffffffffffU));
    }
    vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    if (int64_value != (int64_t *)0x0) {
      *int64_value = i;
    }
  }
  bVar1 = vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&val);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ScriptElement::ConvertBinaryToNumber(int64_t* int64_value) const {
  bool is_success = false;
  std::vector<uint8_t> vch = binary_data_.GetBytes();
  if (((type_ == kElementBinary) || (type_ == kElementNumber)) &&
      (vch.size() <= 5) && ((vch.back() & 0x7f) != 0)) {
    int64_t val = 0;
    for (size_t i = 0; i != vch.size(); ++i) {
      val |= static_cast<int64_t>(vch[i]) << 8 * i;
    }

    if (vch.back() & 0x80) {
      val = -((int64_t)(val & ~(0x80ULL << (8 * (vch.size() - 1)))));
    }
    is_success = true;
    if (int64_value != nullptr) {
      *int64_value = val;
    }
  }
  return is_success;
}